

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::readFromBinary(Binasc *this,ostream *out,istream *input)

{
  int iVar1;
  
  if (this->m_midiQ != 0) {
    iVar1 = outputStyleMidi(this,out,input);
    return iVar1;
  }
  if (this->m_bytesQ == 0) {
    outputStyleAscii(this,out,input);
  }
  else {
    if (this->m_commentsQ == 0) {
      iVar1 = outputStyleBinary(this,out,input);
      return iVar1;
    }
    outputStyleBoth(this,out,input);
  }
  return 1;
}

Assistant:

int Binasc::readFromBinary(std::ostream& out, std::istream& input) {
	int status;
	if (m_midiQ) {
		status = outputStyleMidi(out, input);
	} else if (!m_bytesQ) {
		status = outputStyleAscii(out, input);
	} else if (m_bytesQ && m_commentsQ) {
		status = outputStyleBoth(out, input);
	} else {
		status = outputStyleBinary(out, input);
	}
	return status;
}